

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int P_FindUniqueTID(int start_tid,int limit)

{
  bool bVar1;
  uint uVar2;
  int tid;
  int iVar3;
  int iVar4;
  
  if (start_tid == 0) {
    iVar4 = 0x7fffffff;
    if (limit != 0) {
      iVar4 = limit;
    }
    iVar3 = -5;
    do {
      iVar3 = iVar3 + 5;
      if (iVar4 <= iVar3) {
        return 0;
      }
      uVar2 = FRandom::GenRand32(&pr_uniquetid);
      tid = P_FindUniqueTID((uVar2 & 0x7fffffff) + (uint)((uVar2 & 0x7fffffff) == 0),5);
    } while (tid == 0);
  }
  else {
    tid = start_tid;
    while( true ) {
      if ((start_tid <= -0x80000000 - limit) && (start_tid + limit + -1 < tid)) {
        return 0;
      }
      if ((tid != 0) && (bVar1 = P_IsTIDUsed(tid), !bVar1)) break;
      tid = tid + 1;
    }
  }
  return tid;
}

Assistant:

int P_FindUniqueTID(int start_tid, int limit)
{
	int tid;

	if (start_tid != 0)
	{ // Do a linear search.
		if (start_tid > INT_MAX-limit+1)
		{ // If 'limit+start_tid-1' overflows, clamp 'limit' to INT_MAX
			limit = INT_MAX;
		}
		else
		{
			limit += start_tid-1;
		}
		for (tid = start_tid; tid <= limit; ++tid)
		{
			if (tid != 0 && !P_IsTIDUsed(tid))
			{
				return tid;
			}
		}
		// Nothing free found.
		return 0;
	}
	// Do a random search. To try and be a bit more performant, this
	// actually does several linear searches. In the case of *very*
	// dense TID usage, this could potentially perform worse than doing
	// a complete linear scan starting at 1. However, you would need
	// to use an absolutely ridiculous number of actors before this
	// becomes a real concern.
	if (limit == 0)
	{
		limit = INT_MAX;
	}
	for (int i = 0; i < limit; i += 5)
	{
		// Use a positive starting TID.
		tid = pr_uniquetid.GenRand32() & INT_MAX;
		tid = P_FindUniqueTID(tid == 0 ? 1 : tid, 5);
		if (tid != 0)
		{
			return tid;
		}
	}
	// Nothing free found.
	return 0;
}